

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tweakable.cpp
# Opt level: O1

void __thiscall Corrade::Utility::Tweakable::Data::Data(Data *this,string *prefix,string *replace)

{
  pointer pcVar1;
  
  (this->prefix)._M_dataplus._M_p = (pointer)&(this->prefix).field_2;
  pcVar1 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + prefix->_M_string_length)
  ;
  (this->replace)._M_dataplus._M_p = (pointer)&(this->replace).field_2;
  pcVar1 = (replace->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->replace,pcVar1,pcVar1 + replace->_M_string_length);
  (this->files)._M_h._M_buckets = &(this->files)._M_h._M_single_bucket;
  (this->files)._M_h._M_bucket_count = 1;
  (this->files)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->files)._M_h._M_element_count = 0;
  (this->files)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->files)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->files)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->currentScopeLambda = (_func_void__func_void_ptr_void_ptr *)0x0;
  this->currentScopeUserCall = (_func_void *)0x0;
  this->currentScopeUserData = (void *)0x0;
  return;
}

Assistant:

explicit Data(const std::string& prefix, const std::string& replace): prefix{prefix}, replace{replace} {}